

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.hpp
# Opt level: O0

string * ws::details::xml_parse(string *__return_storage_ptr__,string *xml,string *tag)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  string *this;
  bool bVar1;
  size_type sVar2;
  undefined1 local_148 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  size_type local_e8;
  size_type i;
  string ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  size_type local_80;
  size_type b;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  size_type local_28;
  size_type a;
  string *tag_local;
  string *xml_local;
  
  a = (size_type)tag;
  tag_local = xml;
  xml_local = __return_storage_ptr__;
  std::operator+(&local_68,"<",tag);
  std::operator+(&local_48,&local_68,">");
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (xml,&local_48,0);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  this = tag_local;
  __return_storage_ptr___00 =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)((long)&ret.field_2 + 8)
  ;
  local_28 = sVar2;
  std::operator+(__return_storage_ptr___00,"</",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)a);
  std::operator+(&local_a0,__return_storage_ptr___00,">");
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (this,&local_a0,0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)(ret.field_2._M_local_buf + 8));
  local_80 = sVar2;
  std::__cxx11::string::string((string *)&i);
  sVar2 = local_28;
  local_e8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)a);
  local_e8 = sVar2 + 2 + local_e8;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_108,tag_local,local_e8,local_80 - local_e8);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&tmp.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,0,9);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&tmp.field_2 + 8),"<![CDATA[");
  std::__cxx11::string::~string((string *)(tmp.field_2._M_local_buf + 8));
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,9,
               0xffffffffffffffff);
    sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_148);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,0,
               sVar2 - 3);
    std::__cxx11::string::~string((string *)local_148);
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i);
  }
  std::__cxx11::string::~string((string *)&i);
  return __return_storage_ptr__;
}

Assistant:

std::string xml_parse(const std::string &xml, const std::string &tag)
    {
      auto a = xml.find("<" + tag + ">");
      auto b = xml.find("</" + tag + ">");
      std::string ret;
      auto i = a + tag.size() + 2;
      ret = xml.substr(i, b - i);
      
      if (ret.substr(0, 9) == "<![CDATA[")
      {
        auto tmp = ret.substr(9);
        return tmp.substr(0, tmp.size() - 3);
      }
      return ret;
    }